

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBlock * AnalyzeNamespaceDefinition(ExpressionContext *ctx,SynNamespaceDefinition *syntax)

{
  SynBase *syntax_00;
  int iVar1;
  uint uVar2;
  NamespaceData *parent;
  undefined4 extraout_var;
  TypeBase *pTVar3;
  IdentifierLookupResult *pIVar4;
  ExprBase *node;
  ExprBlock *pEVar5;
  SmallArray<NamespaceData_*,_2U> *this_00;
  ExpressionContext *this_01;
  SynIdentifier *pSVar6;
  IntrusiveList<SynBase> *pIVar7;
  IntrusiveList<ExprBase> expressions;
  NamespaceData *this;
  undefined4 extraout_var_00;
  
  if ((ctx->scope != ctx->globalScope) && (ctx->scope->ownerNamespace == (NamespaceData *)0x0)) {
    anon_unknown.dwarf_94284::Stop
              (ctx,&syntax->super_SynBase,
               "ERROR: a namespace definition must appear either at file scope or immediately within another namespace definition"
              );
  }
  pSVar6 = (syntax->path).head;
  this_01 = ctx;
  while (pSVar6 != (SynIdentifier *)0x0) {
    parent = ExpressionContext::GetCurrentNamespace(this_01,ctx->scope);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xa0);
    this = (NamespaceData *)CONCAT44(extraout_var,iVar1);
    uVar2 = ctx->uniqueNamespaceId;
    ctx->uniqueNamespaceId = uVar2 + 1;
    NamespaceData::NamespaceData
              (this,ctx->allocator,&syntax->super_SynBase,ctx->scope,parent,pSVar6,uVar2);
    expressions.head = (ExprBase *)this;
    pTVar3 = anon_unknown.dwarf_94284::LookupTypeByName(ctx,this->fullNameHash);
    if (pTVar3 != (TypeBase *)0x0) {
      anon_unknown.dwarf_94284::Report
                (ctx,&syntax->super_SynBase,"ERROR: name \'%.*s\' is already taken for a type",
                 (ulong)(uint)(*(int *)&(this->name).name.end - (int)(this->name).name.begin));
    }
    uVar2 = InplaceStr::hash(&(this->name).name);
    pIVar4 = anon_unknown.dwarf_94284::LookupObjectByName(ctx,uVar2);
    if (pIVar4 != (IdentifierLookupResult *)0x0) {
      if ((pIVar4->variable != (VariableData *)0x0) && (pIVar4->variable->scope == ctx->scope)) {
        anon_unknown.dwarf_94284::Report
                  (ctx,&syntax->super_SynBase,
                   "ERROR: name \'%.*s\' is already taken for a variable in current scope",
                   (ulong)(uint)(*(int *)&(this->name).name.end - (int)(this->name).name.begin));
      }
      if ((pIVar4->function != (FunctionData *)0x0) && (pIVar4->function->scope == ctx->scope)) {
        anon_unknown.dwarf_94284::Report
                  (ctx,&syntax->super_SynBase,"ERROR: name \'%.*s\' is already taken for a function"
                   ,(ulong)(uint)(*(int *)&(this->name).name.end - (int)(this->name).name.begin));
      }
    }
    this_00 = &parent->children;
    if (parent == (NamespaceData *)0x0) {
      this_00 = &ctx->globalNamespaces;
    }
    SmallArray<NamespaceData_*,_2U>::push_back(this_00,(NamespaceData **)&expressions);
    SmallArray<NamespaceData_*,_128U>::push_back(&ctx->namespaces,(NamespaceData **)&expressions);
    this_01 = ctx;
    ExpressionContext::PushScope(ctx,(NamespaceData *)expressions.head);
    pSVar6 = (SynIdentifier *)(pSVar6->super_SynBase).next;
    if ((pSVar6 == (SynIdentifier *)0x0) || ((pSVar6->super_SynBase).typeID != 4)) {
      pSVar6 = (SynIdentifier *)0x0;
    }
  }
  expressions.head = (ExprBase *)0x0;
  expressions.tail = (ExprBase *)0x0;
  pIVar7 = &syntax->expressions;
  while (syntax_00 = pIVar7->head, syntax_00 != (SynBase *)0x0) {
    node = AnalyzeStatement(ctx,syntax_00);
    IntrusiveList<ExprBase>::push_back(&expressions,node);
    pIVar7 = (IntrusiveList<SynBase> *)&syntax_00->next;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar5 = (ExprBlock *)CONCAT44(extraout_var_00,iVar1);
  pTVar3 = ctx->typeVoid;
  (pEVar5->super_ExprBase).typeID = 0x36;
  (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
  (pEVar5->super_ExprBase).type = pTVar3;
  (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar5->super_ExprBase).listed = false;
  (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002240b0;
  (pEVar5->expressions).head = expressions.head;
  (pEVar5->expressions).tail = expressions.tail;
  pEVar5->closures = (ExprBase *)0x0;
  pSVar6 = (syntax->path).head;
  while (pSVar6 != (SynIdentifier *)0x0) {
    ExpressionContext::PopScope(ctx,SCOPE_NAMESPACE);
    pSVar6 = (SynIdentifier *)(pSVar6->super_SynBase).next;
    if ((pSVar6 == (SynIdentifier *)0x0) || ((pSVar6->super_SynBase).typeID != 4)) {
      pSVar6 = (SynIdentifier *)0x0;
    }
  }
  return pEVar5;
}

Assistant:

ExprBlock* AnalyzeNamespaceDefinition(ExpressionContext &ctx, SynNamespaceDefinition *syntax)
{
	if(ctx.scope != ctx.globalScope && ctx.scope->ownerNamespace == NULL)
		Stop(ctx, syntax, "ERROR: a namespace definition must appear either at file scope or immediately within another namespace definition");

	for(SynIdentifier *name = syntax->path.head; name; name = getType<SynIdentifier>(name->next))
	{
		NamespaceData *parent = ctx.GetCurrentNamespace(ctx.scope);

		NamespaceData *ns = new (ctx.get<NamespaceData>()) NamespaceData(ctx.allocator, syntax, ctx.scope, parent, *name, ctx.uniqueNamespaceId++);

		CheckNamespaceConflict(ctx, syntax, ns);

		if(parent)
			parent->children.push_back(ns);
		else
			ctx.globalNamespaces.push_back(ns);

		ctx.namespaces.push_back(ns);

		ctx.PushScope(ns);
	}

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, NULL);

	for(SynIdentifier *name = syntax->path.head; name; name = getType<SynIdentifier>(name->next))
		ctx.PopScope(SCOPE_NAMESPACE);

	return block;
}